

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O2

void __thiscall
XmlModelSerialiserPrivate::writeXmlElement
          (XmlModelSerialiserPrivate *this,QXmlStreamWriter *destination,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  QArrayDataPointer<char16_t> local_d0;
  QString roleString;
  QVariant roleData;
  QArrayDataPointer<char16_t> local_78;
  int local_54;
  XmlModelSerialiserPrivate *local_50;
  QArrayDataPointer<char16_t> local_48;
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
  if (iVar4 + iVar3 != 0) {
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7ac4;
    roleData.d.data._16_8_ = 7;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    roleString.d.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)destination);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7ae7;
    roleString.d.size = 0;
    roleData.d.data._16_8_ = 8;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
    QString::number((int)&local_d0,iVar3);
    QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7afd;
    roleData.d.data._16_8_ = 0xb;
    roleString.d.size = 0;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
    QString::number((int)&local_d0,iVar3);
    QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleString);
    iVar3 = 0;
    local_50 = this;
    while( true ) {
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_constModel;
      iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
      if (iVar4 <= iVar3) break;
      iVar4 = 0;
      local_54 = iVar3;
      while( true ) {
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        iVar5 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
        if (iVar5 <= iVar4) break;
        roleData.d.data.shared = (PrivateShared *)0x0;
        roleData.d.data._8_8_ = anon_var_dwarf_a7b13;
        roleData.d.data._16_8_ = 4;
        roleString.d.d = (Data *)0x0;
        roleString.d.ptr = (char16_t *)0x0;
        roleString.d.size = 0;
        QXmlStreamWriter::writeStartElement((QString *)destination);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleString);
        roleData.d.data.shared = (PrivateShared *)0x0;
        roleData.d.data._8_8_ = anon_var_dwarf_a7b29;
        roleData.d.data._16_8_ = 3;
        roleString.d.d = (Data *)0x0;
        roleString.d.ptr = (char16_t *)0x0;
        roleString.d.size = 0;
        QXmlStreamWriter::writeStartElement((QString *)destination);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleString);
        iVar5 = (int)(QModelIndex *)&roleData;
        QString::number(iVar5,iVar3);
        QXmlStreamWriter::writeCharacters((QString *)destination);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
        QXmlStreamWriter::writeEndElement();
        roleData.d.data.shared = (PrivateShared *)0x0;
        roleData.d.data._8_8_ = anon_var_dwarf_a7b3f;
        roleData.d.data._16_8_ = 6;
        roleString.d.d = (Data *)0x0;
        roleString.d.ptr = (char16_t *)0x0;
        roleString.d.size = 0;
        QXmlStreamWriter::writeStartElement((QString *)destination);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleString);
        QString::number(iVar5,iVar4);
        QXmlStreamWriter::writeCharacters((QString *)destination);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
        QXmlStreamWriter::writeEndElement();
        piVar6 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_rolesToSave.d.ptr;
        for (piVar7 = piVar6;
            piVar7 != piVar6 + (this->super_AbstractStringSerialiserPrivate).
                               super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size;
            piVar7 = piVar7 + 1) {
          pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_constModel;
          (**(code **)(*(long *)pQVar1 + 0x60))
                    ((QModelIndex *)&roleString,pQVar1,iVar3,iVar4,parent);
          QModelIndex::data(&roleData,(QModelIndex *)&roleString,*piVar7);
          cVar2 = ::QVariant::isNull();
          if (cVar2 == '\0') {
            AbstractStringSerialiserPrivate::saveVariant
                      (&roleString,&this->super_AbstractStringSerialiserPrivate,&roleData);
            if (roleString.d.size != 0) {
              local_d0.d = (Data *)0x0;
              local_d0.ptr = L"DataPoint";
              local_d0.size = 9;
              local_78.d = (Data *)0x0;
              local_78.ptr = (char16_t *)0x0;
              local_78.size = 0;
              QXmlStreamWriter::writeStartElement((QString *)destination);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
              local_d0.d = (Data *)0x0;
              local_d0.ptr = L"Role";
              local_d0.size = 4;
              local_78.d = (Data *)0x0;
              local_78.ptr = (char16_t *)0x0;
              local_78.size = 0;
              iVar5 = (int)&local_48;
              QString::number(iVar5,*piVar7);
              QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&local_d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
              local_d0.d = (Data *)0x0;
              local_d0.ptr = L"Type";
              local_d0.size = 4;
              local_78.d = (Data *)0x0;
              local_78.ptr = (char16_t *)0x0;
              local_78.size = 0;
              iVar3 = ::QVariant::typeId(&roleData);
              QString::number(iVar5,iVar3);
              QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&local_d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
              QXmlStreamWriter::writeCharacters((QString *)destination);
              this = local_50;
              iVar3 = local_54;
              QXmlStreamWriter::writeEndElement();
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&roleString);
          }
          ::QVariant::~QVariant(&roleData);
          piVar6 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr;
        }
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        (**(code **)(*(long *)pQVar1 + 0x60))((QModelIndex *)&roleData,pQVar1,iVar3,iVar4,parent);
        cVar2 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,(QModelIndex *)&roleData);
        if (cVar2 != '\0') {
          pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_constModel;
          (**(code **)(*(long *)pQVar1 + 0x60))((QModelIndex *)&roleData,pQVar1,iVar3,iVar4,parent);
          writeXmlElement(this,destination,(QModelIndex *)&roleData);
        }
        QXmlStreamWriter::writeEndElement();
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar3 + 1;
    }
    QXmlStreamWriter::writeEndElement();
  }
  return;
}

Assistant:

void XmlModelSerialiserPrivate::writeXmlElement(QXmlStreamWriter &destination, const QModelIndex &parent) const
{
    Q_ASSERT(m_constModel);
    if (m_constModel->rowCount(parent) + m_constModel->columnCount(parent) == 0)
        return;
    destination.writeStartElement(QStringLiteral("Element"));
    destination.writeAttribute(QStringLiteral("RowCount"), QString::number(m_constModel->rowCount(parent)));
    destination.writeAttribute(QStringLiteral("ColumnCount"), QString::number(m_constModel->columnCount(parent)));
    for (int i = 0; i < m_constModel->rowCount(parent); ++i) {
        for (int j = 0; j < m_constModel->columnCount(parent); ++j) {
            destination.writeStartElement(QStringLiteral("Cell"));
            destination.writeStartElement(QStringLiteral("Row"));
            destination.writeCharacters(QString::number(i));
            destination.writeEndElement(); // Row
            destination.writeStartElement(QStringLiteral("Column"));
            destination.writeCharacters(QString::number(j));
            destination.writeEndElement(); // Column
            for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
                const QVariant roleData = m_constModel->index(i, j, parent).data(*singleRole);
                if (roleData.isNull())
                    continue; // Skip empty roles
                const QString roleString = saveVariant(roleData);
                if (roleString.isEmpty())
                    continue; // Skip unhandled types
                destination.writeStartElement(QStringLiteral("DataPoint"));
                destination.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
                destination.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
                destination.writeCharacters(roleString);
                destination.writeEndElement(); // DataPoint
            }
            if (m_constModel->hasChildren(m_constModel->index(i, j, parent))) {
                writeXmlElement(destination, m_constModel->index(i, j, parent));
            }
            destination.writeEndElement(); // Cell
        }
    }
    destination.writeEndElement(); // Element
}